

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LibString.cpp
# Opt level: O2

int lib::string::Char(State *state)

{
  bool bVar1;
  int iVar2;
  int index;
  StackAPI api;
  string str;
  
  luna::StackAPI::StackAPI(&api,state);
  iVar2 = luna::StackAPI::GetStackSize(&api);
  str._M_dataplus._M_p = (pointer)&str.field_2;
  str._M_string_length = 0;
  str.field_2._M_local_buf[0] = '\0';
  index = 0;
  if (iVar2 < 1) {
    iVar2 = 0;
  }
  do {
    if (iVar2 == index) {
      luna::StackAPI::PushString(&api,&str);
      iVar2 = 1;
LAB_0012a46d:
      std::__cxx11::string::~string((string *)&str);
      return iVar2;
    }
    bVar1 = luna::StackAPI::IsNumber(&api,index);
    if (!bVar1) {
      iVar2 = 0;
      luna::StackAPI::ArgTypeError(&api,index,ValueT_Number);
      goto LAB_0012a46d;
    }
    luna::StackAPI::GetNumber(&api,index);
    std::__cxx11::string::push_back((char)&str);
    index = index + 1;
  } while( true );
}

Assistant:

int Char(luna::State *state)
    {
        luna::StackAPI api(state);
        int params = api.GetStackSize();

        std::string str;
        for (int i = 0; i < params; ++i)
        {
            if (!api.IsNumber(i))
            {
                api.ArgTypeError(i, luna::ValueT_Number);
                return 0;
            }
            else
            {
                str.push_back(static_cast<int>(api.GetNumber(i)));
            }
        }

        api.PushString(str);
        return 1;
    }